

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void perf_interpolate_step
               (_func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr
                *function,int row,int col,response_layer *top,response_layer *middle,
               response_layer *bottom,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  _func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr *p_Var5;
  response_layer *prVar6;
  response_layer *prVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar17 [16];
  vector<double,_std::allocator<double>_> cycleslist;
  float offsets_1 [3];
  double local_b0;
  long local_a0;
  double local_90;
  double *local_88;
  double *pdStack_80;
  double *local_78;
  uint local_6c;
  _func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr *local_68;
  response_layer *local_60;
  long local_58;
  response_layer *local_50;
  double local_48;
  float local_3c [3];
  
  dVar13 = 1.0;
  local_a0 = 100;
  local_68 = function;
  local_60 = top;
  local_50 = middle;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_a0 = (long)(dVar13 * (double)local_a0);
    p_Var5 = local_68;
    prVar6 = local_60;
    prVar7 = local_50;
    for (lVar10 = local_a0; local_68 = p_Var5, local_60 = prVar6, local_50 = prVar7, lVar10 != 0;
        lVar10 = lVar10 + -1) {
      (*function)(row,col,top,prVar7,bottom,(float *)&local_88);
      p_Var5 = local_68;
      prVar6 = local_60;
      prVar7 = local_50;
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar12 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) -
                                 (uVar1 & 0xffffffff)) +
                                 (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_90 = auVar12._0_8_;
    dVar13 = 100000000.0 / local_90;
  } while (2.0 < dVar13);
  local_88 = (double *)0x0;
  pdStack_80 = (double *)0x0;
  local_48 = (double)local_a0;
  local_78 = (double *)0x0;
  lVar10 = 0;
  local_b0 = 0.0;
  do {
    cpuid_basic_info(0);
    uVar3 = rdtsc();
    local_6c = (uint)uVar3;
    local_58 = lVar10;
    for (lVar11 = local_a0; lVar11 != 0; lVar11 = lVar11 + -1) {
      (*p_Var5)(row,col,prVar6,prVar7,bottom,local_3c);
    }
    uVar1 = rdtsc();
    cpuid_basic_info(0);
    auVar12 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)((ulong)uVar3 >> 0x20) << 0x20) -
                                 (ulong)local_6c) +
                                 (uVar1 & 0xffffffff) + (uVar1 & 0xffffffff00000000));
    dVar13 = auVar12._0_8_ / local_48;
    local_90 = dVar13;
    if (pdStack_80 == local_78) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_88,(iterator)pdStack_80,&local_90);
    }
    else {
      *pdStack_80 = dVar13;
      pdStack_80 = pdStack_80 + 1;
    }
    pdVar9 = pdStack_80;
    pdVar8 = local_88;
    lVar10 = local_58 + 1;
    local_b0 = local_b0 + dVar13;
  } while (lVar10 != 10);
  local_b0 = local_b0 / 10.0;
  lVar10 = *(long *)(data + 0x210);
  local_90 = local_b0;
  if (local_88 != pdStack_80) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88,pdStack_80,(int)LZCOUNT((long)pdStack_80 - (long)local_88 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar8,pdVar9);
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_90;
  auVar15._0_8_ = ((double)lVar10 * 100.0) / local_b0;
  auVar15._8_8_ = 0;
  auVar17._8_8_ = 0x3fdfffffffffffff;
  auVar17._0_8_ = 0x3fdfffffffffffff;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar12 = vpternlogq_avx512vl(auVar17,auVar15,auVar4,0xf8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar15._0_8_ + auVar12._0_8_;
  auVar4 = vroundsd_avx(auVar16,auVar16,0xb);
  auVar12 = vmovhpd_avx(auVar14,*local_88);
  auVar12 = vcvttpd2uqq_avx512vl(auVar12);
  auVar12 = vpaddq_avx(auVar12,*(undefined1 (*) [16])(data + 0x218));
  *(undefined1 (*) [16])(data + 0x218) = auVar12;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = pdStack_80[-1];
  lVar10 = vcvttsd2usi_avx512f(auVar12);
  *(long *)(data + 0x228) = *(long *)(data + 0x228) + lVar10;
  *(double *)(data + 0x230) = auVar4._0_8_ / 100.0 + *(double *)(data + 0x230);
  operator_delete(local_88,(long)local_78 - (long)local_88);
  return;
}

Assistant:

void perf_interpolate_step(void (*function)(int, int, struct response_layer *, struct response_layer *, struct response_layer *, float[3]),
                           int row, int col, struct response_layer *top, struct response_layer *middle,
                           struct response_layer *bottom, struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            float offsets[3];
            (*function)(row, col, top, middle, bottom, offsets);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            float offsets[3];
            (*function)(row, col, top, middle, bottom, offsets);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}